

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decNumber.cpp
# Opt level: O3

decNumber * uprv_decNumberAnd_63(decNumber *res,decNumber *lhs,decNumber *rhs,decContext *set)

{
  uint8_t *puVar1;
  int iVar2;
  int iVar3;
  uint8_t *puVar4;
  byte bVar5;
  uint8_t *puVar6;
  uint8_t *puVar7;
  ulong uVar8;
  uint8_t *puVar9;
  ulong uVar10;
  uint8_t *puVar11;
  byte bVar12;
  ulong uVar13;
  
  if ((((lhs->exponent != 0) || (0xf < lhs->bits)) || (rhs->exponent != 0)) || (0xf < rhs->bits)) {
LAB_00245d7d:
    res->digits = 1;
    res->exponent = 0;
    res->bits = ' ';
    res->lsu[0] = '\0';
    uprv_decContextSetStatus_63(set,0x80);
    return res;
  }
  uVar8 = (ulong)lhs->digits;
  if ((long)uVar8 < 0x32) {
    uVar8 = (ulong)""[uVar8];
  }
  uVar10 = (ulong)rhs->digits;
  if ((long)uVar10 < 0x32) {
    uVar10 = (ulong)""[uVar10];
  }
  puVar1 = res->lsu;
  uVar13 = (ulong)set->digits;
  puVar7 = puVar1;
  if ((long)uVar13 < 0x32) {
    if (set->digits == 0) goto LAB_00245d3f;
    uVar13 = (ulong)""[uVar13];
  }
  puVar6 = lhs->lsu;
  puVar4 = rhs->lsu;
  puVar9 = puVar6 + ((uVar8 & 0xffffffff) - 1);
  puVar11 = puVar4 + ((uVar10 & 0xffffffff) - 1);
  do {
    if (puVar9 < puVar6) {
      bVar12 = 0;
    }
    else {
      bVar12 = *puVar6;
    }
    if (puVar11 < puVar4) {
      bVar5 = 0;
    }
    else {
      bVar5 = *puVar4;
    }
    *puVar7 = '\0';
    if ((bVar5 != 0 || bVar12 != 0) &&
       (*puVar7 = bVar12 & bVar5 & 1,
       1 < (byte)(bVar5 + (bVar5 / 5 & 0xfe) * -5 | bVar12 + (bVar12 / 5 & 0xfe) * -5)))
    goto LAB_00245d7d;
    puVar6 = puVar6 + 1;
    puVar4 = puVar4 + 1;
    puVar7 = puVar7 + 1;
  } while (puVar7 <= res->lsu + (uVar13 - 1));
LAB_00245d3f:
  iVar3 = (int)puVar7 - (int)puVar1;
  puVar4 = puVar1 + (long)iVar3 + -1;
  if (puVar1 <= puVar4) {
    iVar2 = ((int)puVar7 - (int)res) + -10;
    do {
      iVar3 = iVar2;
      if ((*puVar4 != '\0') || (iVar3 == 0)) {
        iVar3 = iVar3 + 1;
        break;
      }
      puVar4 = puVar4 + -1;
      iVar2 = iVar3 + -1;
    } while (puVar1 <= puVar4);
  }
  res->digits = iVar3;
  res->exponent = 0;
  res->bits = '\0';
  return res;
}

Assistant:

U_CAPI decNumber * U_EXPORT2 uprv_decNumberAnd(decNumber *res, const decNumber *lhs,
                         const decNumber *rhs, decContext *set) {
  const Unit *ua, *ub;                  /* -> operands  */
  const Unit *msua, *msub;              /* -> operand msus  */
  Unit *uc,  *msuc;                     /* -> result and its msu  */
  Int   msudigs;                        /* digits in res msu  */
  #if DECCHECK
  if (decCheckOperands(res, lhs, rhs, set)) return res;
  #endif

  if (lhs->exponent!=0 || decNumberIsSpecial(lhs) || decNumberIsNegative(lhs)
   || rhs->exponent!=0 || decNumberIsSpecial(rhs) || decNumberIsNegative(rhs)) {
    decStatus(res, DEC_Invalid_operation, set);
    return res;
    }

  /* operands are valid  */
  ua=lhs->lsu;                          /* bottom-up  */
  ub=rhs->lsu;                          /* ..  */
  uc=res->lsu;                          /* ..  */
  msua=ua+D2U(lhs->digits)-1;           /* -> msu of lhs  */
  msub=ub+D2U(rhs->digits)-1;           /* -> msu of rhs  */
  msuc=uc+D2U(set->digits)-1;           /* -> msu of result  */
  msudigs=MSUDIGITS(set->digits);       /* [faster than remainder]  */
  for (; uc<=msuc; ua++, ub++, uc++) {  /* Unit loop  */
    Unit a, b;                          /* extract units  */
    if (ua>msua) a=0;
     else a=*ua;
    if (ub>msub) b=0;
     else b=*ub;
    *uc=0;                              /* can now write back  */
    if (a|b) {                          /* maybe 1 bits to examine  */
      Int i, j;
      *uc=0;                            /* can now write back  */
      /* This loop could be unrolled and/or use BIN2BCD tables  */
      for (i=0; i<DECDPUN; i++) {
        if (a&b&1) *uc=*uc+(Unit)powers[i];  /* effect AND  */
        j=a%10;
        a=a/10;
        j|=b%10;
        b=b/10;
        if (j>1) {
          decStatus(res, DEC_Invalid_operation, set);
          return res;
          }
        if (uc==msuc && i==msudigs-1) break; /* just did final digit  */
        } /* each digit  */
      } /* both OK  */
    } /* each unit  */
  /* [here uc-1 is the msu of the result]  */
  res->digits=decGetDigits(res->lsu, static_cast<int32_t>(uc - res->lsu));
  res->exponent=0;                      /* integer  */
  res->bits=0;                          /* sign=0  */
  return res;  /* [no status to set]  */
  }